

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O0

string * choc::text::trim(string *__return_storage_ptr__,string *text)

{
  string local_58;
  string local_38;
  string *local_18;
  string *text_local;
  
  local_18 = text;
  text_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_58,(string *)text);
  trimEnd(&local_38,&local_58);
  trimStart(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::string      trim (std::string      text)    { return trimStart (trimEnd (std::move (text))); }